

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O3

deUint32 __thiscall
deqp::gles3::Functional::Framebuffer::createTex2D
          (Framebuffer *this,deUint32 name,GLenum format,int width,int height)

{
  ulong uVar1;
  uint uVar2;
  uint local_2c;
  
  uVar1 = (ulong)name;
  local_2c = name;
  if (name == 0) {
    (*this->m_context->_vptr_Context[7])(this->m_context,1,&local_2c);
    uVar1 = (ulong)local_2c;
  }
  (*this->m_context->_vptr_Context[6])(this->m_context,0xde1,uVar1);
  (*this->m_context->_vptr_Context[0x7e])
            (this->m_context,0xde1,0,(ulong)format,(ulong)(uint)width,height);
  if (((width & width - 1U) != 0) ||
     (uVar2 = height - ((uint)height >> 1 & 0x55555555),
     uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333),
     1 < ((uVar2 >> 4) + uVar2 & 0xf0f0f0f) * 0x1010101 >> 0x18)) {
    (*this->m_context->_vptr_Context[0x1d])(this->m_context,0xde1,0x2802,0x812f);
    (*this->m_context->_vptr_Context[0x1d])(this->m_context,0xde1,0x2803,0x812f);
  }
  (*this->m_context->_vptr_Context[0x1d])(this->m_context,0xde1,0x2801,0x2600);
  (*this->m_context->_vptr_Context[0x1d])(this->m_context,0xde1,0x2800,0x2600);
  return local_2c;
}

Assistant:

deUint32 Framebuffer::createTex2D (deUint32 name, GLenum format, int width, int height)
{
	if (name == 0)
		m_context.genTextures(1, &name);

	m_context.bindTexture(GL_TEXTURE_2D, name);
	m_context.texImage2D(GL_TEXTURE_2D, 0, format, width, height);

	if (!deIsPowerOfTwo32(width) || !deIsPowerOfTwo32(height))
	{
		// Set wrap mode to clamp for NPOT FBOs
		m_context.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		m_context.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	}

	m_context.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	m_context.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);

	return name;
}